

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator==(Am_Value *this,char *test_value)

{
  uint uVar1;
  char *test_value_local;
  Am_Value *this_local;
  
  uVar1 = (uint)this->type;
  if ((uVar1 - 2 < 2) || (uVar1 == 9)) {
    this_local._7_1_ = (this->value).wrapper_value == (Am_Wrapper *)0x0 && test_value == (char *)0x0
    ;
  }
  else if (uVar1 == 0x8008) {
    this_local._7_1_ =
         Am_String_Data::operator==((Am_String_Data *)(this->value).wrapper_value,test_value);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator==(const char *test_value) const
{
  switch (type) {
  case Am_STRING:
    return *(Am_String_Data *)value.wrapper_value == test_value;
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return !value.voidptr_value && !test_value;
  default:
    return false;
  }
}